

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos parse_then(LexState *ls)

{
  BCPos BVar1;
  LexState *unaff_retaddr;
  BCPos condexit;
  LexToken in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  lj_lex_next((LexState *)0x149fa3);
  BVar1 = expr_cond(unaff_retaddr);
  lex_check((LexState *)CONCAT44(BVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  parse_block(unaff_retaddr);
  return BVar1;
}

Assistant:

static BCPos parse_then(LexState *ls)
{
  BCPos condexit;
  lj_lex_next(ls);  /* Skip 'if' or 'elseif'. */
  condexit = expr_cond(ls);
  lex_check(ls, TK_then);
  parse_block(ls);
  return condexit;
}